

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O3

bool __thiscall TasgridWrapper::readGridfile(TasgridWrapper *this)

{
  TypeOneDRule TVar1;
  undefined8 uVar2;
  
  TasGrid::TasmanianSparseGrid::read((char *)this);
  if (*(long *)&this->field_0x8 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined8 *)(*(long *)&this->field_0x8 + 0x10);
  }
  this->num_dimensions = (int)uVar2;
  this->num_outputs = (int)((ulong)uVar2 >> 0x20);
  TVar1 = TasGrid::TasmanianSparseGrid::getRule();
  this->rule = TVar1;
  return true;
}

Assistant:

bool TasgridWrapper::readGridfile(){
    try{
        grid.read(gridfilename);
    }catch(std::runtime_error &e){
        cerr << e.what() << "\n";
        return false;
    }
    num_dimensions = grid.getNumDimensions();
    num_outputs = grid.getNumOutputs();
    rule = grid.getRule();
    return true;
}